

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_memorymapid_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  int iVar1;
  int32_t old;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  iVar1 = env->CP0_MemoryMapID;
  env->CP0_MemoryMapID = (int32_t)arg1;
  if (iVar1 != env->CP0_MemoryMapID) {
    cpu_mips_tlb_flush_mips64(env);
  }
  return;
}

Assistant:

void helper_mtc0_memorymapid(CPUMIPSState *env, target_ulong arg1)
{
    int32_t old;
    old = env->CP0_MemoryMapID;
    env->CP0_MemoryMapID = (int32_t) arg1;
    /* If the MemoryMapID changes, flush qemu's TLB.  */
    if (old != env->CP0_MemoryMapID) {
        cpu_mips_tlb_flush(env);
    }
}